

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.hpp
# Opt level: O1

void __thiscall
pstore::database::database<pstore::file::in_memory>
          (database *this,shared_ptr<pstore::file::in_memory> *file,
          unique_ptr<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
          *page_size,
          unique_ptr<pstore::region::factory,_std::default_delete<pstore::region::factory>_>
          *region_factory,bool access_tick_enabled)

{
  typed_address<pstore::trailer> tVar1;
  
  this->_vptr_database = (_func_int **)&PTR__database_0019e1c8;
  storage::storage<pstore::file::in_memory>(&this->storage_,file,page_size,region_factory);
  (this->lock_)._M_device = (mutex_type *)0x0;
  (this->lock_)._M_owns = false;
  this->vacuum_mode_ = disabled;
  this->modified_ = false;
  this->closed_ = false;
  (this->header_).super___shared_ptr<pstore::header,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->header_).super___shared_ptr<pstore::header,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->range_lock_).file_ = (file_base *)0x0;
  (this->range_lock_).offset_ = 0;
  *(undefined8 *)((long)&(this->range_lock_).offset_ + 5) = 0;
  *(undefined8 *)((long)&(this->range_lock_).size_ + 5) = 0;
  tVar1 = get_footer_pos<pstore::file::in_memory>
                    ((file->super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>)
                     ._M_ptr);
  (this->size_).footer_pos_.a_.a_ = (value_type)tVar1.a_.a_;
  (this->size_).logical_ = (long)tVar1.a_.a_ + 0x70;
  (this->indices_)._M_elems[0].
  super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->indices_)._M_elems[0].
  super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->indices_)._M_elems[1].
  super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->indices_)._M_elems[1].
  super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->indices_)._M_elems[2].
  super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->indices_)._M_elems[2].
  super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->indices_)._M_elems[3].
  super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->indices_)._M_elems[3].
  super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->indices_)._M_elems[4].
  super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->indices_)._M_elems[4].
  super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->indices_)._M_elems[5].
  super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->indices_)._M_elems[5].
  super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->sync_name_)._M_dataplus._M_p = (pointer)&(this->sync_name_).field_2;
  (this->sync_name_)._M_string_length = 0;
  (this->sync_name_).field_2._M_local_buf[0] = '\0';
  finish_init(this,access_tick_enabled);
  return;
}

Assistant:

database::database (std::shared_ptr<File> const & file,
                        std::unique_ptr<system_page_size_interface> && page_size,
                        std::unique_ptr<region::factory> && region_factory,
                        bool const access_tick_enabled)
            : storage_{file, std::move (page_size), std::move (region_factory)}
            , size_{database::get_footer_pos (*file)} {

        this->finish_init (access_tick_enabled);
    }